

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

Block * __thiscall wasm::Builder::blockify(Builder *this,Expression *any,Expression *append)

{
  Block *this_00;
  optional<wasm::Type> type_;
  
  this_00 = (Block *)0x0;
  if ((any != (Expression *)0x0) && (any->_id == BlockId)) {
    this_00 = (Block *)any;
  }
  if (this_00 == (Block *)0x0) {
    this_00 = makeBlock(this,any);
  }
  if (append != (Expression *)0x0) {
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(this_00->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,append);
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)append;
    Block::finalize(this_00,type_,Unknown);
  }
  return this_00;
}

Assistant:

Block* blockify(Expression* any, Expression* append = nullptr) {
    Block* block = nullptr;
    if (any) {
      block = any->dynCast<Block>();
    }
    if (!block) {
      block = makeBlock(any);
    }
    if (append) {
      block->list.push_back(append);
      block->finalize();
    }
    return block;
  }